

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O0

string * cppcms::http::protocol::unquote<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           end)

{
  bool bVar1;
  reference pcVar2;
  undefined8 *in_RSI;
  string *in_RDI;
  char c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  string *result;
  string *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char local_41;
  char *local_40;
  undefined1 local_21;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 *local_18;
  
  local_20._M_current = (char *)*in_RSI;
  local_21 = 0;
  __lhs = in_RDI;
  local_18 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = __gnu_cxx::operator>=
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_RDI);
  if ((!bVar1) &&
     (pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20), *pcVar2 == '\"')) {
    __gnu_cxx::operator-
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDI);
    std::__cxx11::string::reserve((ulong)in_RDI);
    local_40 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++(in_stack_ffffffffffffffa8._M_current,(int)((ulong)__lhs >> 0x20)
                                   );
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_RDI), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_stack_ffffffffffffffa8._M_current,(int)((ulong)__lhs >> 0x20));
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      local_41 = *pcVar2;
      if (local_41 == '\"') {
        *local_18 = local_20._M_current;
        return __lhs;
      }
      if ((local_41 == '\\') &&
         (bVar1 = __gnu_cxx::operator<
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_RDI), bVar1)) {
        in_stack_ffffffffffffffa8 =
             __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator++(in_stack_ffffffffffffffa8._M_current,(int)((ulong)__lhs >> 0x20));
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xffffffffffffffa8);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,local_41);
      }
    }
    std::__cxx11::string::clear();
  }
  return __lhs;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}